

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

string * __thiscall
test_pad_reflect_1d::vars_abi_cxx11_(string *__return_storage_ptr__,test_pad_reflect_1d *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  char *__s;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  __s = (char *)ggml_type_name(this->type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,__s,(allocator<char> *)&local_190);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x166cda);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*plVar3;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_100 = *puVar6;
    lStack_f8 = plVar3[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar6;
    local_110 = (ulong *)*plVar3;
  }
  local_108 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  var_to_str<long,4ul>(&local_70,&this->ne_a);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x166c9d);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_180 = *puVar6;
    lStack_178 = plVar3[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar6;
    local_190 = (ulong *)*plVar3;
  }
  local_188 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  uVar7 = 0xf;
  if (local_110 != &local_100) {
    uVar7 = local_100;
  }
  if (uVar7 < (ulong)(local_188 + local_108)) {
    uVar7 = 0xf;
    if (local_190 != &local_180) {
      uVar7 = local_180;
    }
    if (uVar7 < (ulong)(local_188 + local_108)) goto LAB_001519e3;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_001519e3:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_190);
  }
  local_170 = &local_160;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_160 = *plVar3;
    uStack_158 = puVar4[3];
  }
  else {
    local_160 = *plVar3;
    local_170 = (long *)*puVar4;
  }
  local_168 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_1a0 = *puVar6;
    lStack_198 = plVar3[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar6;
    local_1b0 = (ulong *)*plVar3;
  }
  local_1a8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  var_to_str<int>(&local_90,(int *)(ulong)(uint)this->pad_0);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x167095);
  local_1d0 = &local_1c0;
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_1c0 = *puVar6;
    lStack_1b8 = plVar3[3];
  }
  else {
    local_1c0 = *puVar6;
    local_1d0 = (ulong *)*plVar3;
  }
  local_1c8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  uVar7 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar7 = local_1a0;
  }
  if (uVar7 < (ulong)(local_1c8 + local_1a8)) {
    uVar7 = 0xf;
    if (local_1d0 != &local_1c0) {
      uVar7 = local_1c0;
    }
    if (uVar7 < (ulong)(local_1c8 + local_1a8)) goto LAB_00151b59;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_00151b59:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_1d0);
  }
  local_150 = &local_140;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_140 = *plVar3;
    uStack_138 = puVar4[3];
  }
  else {
    local_140 = *plVar3;
    local_150 = (long *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_e0 = *puVar6;
    lStack_d8 = plVar3[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar6;
    local_f0 = (ulong *)*plVar3;
  }
  local_e8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  var_to_str<int>(&local_b0,(int *)(ulong)(uint)this->pad_1);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x16709c);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_120 = *puVar6;
    lStack_118 = plVar3[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar6;
    local_130 = (ulong *)*plVar3;
  }
  local_128 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  uVar7 = 0xf;
  if (local_f0 != &local_e0) {
    uVar7 = local_e0;
  }
  if (uVar7 < (ulong)(local_128 + local_e8)) {
    uVar7 = 0xf;
    if (local_130 != &local_120) {
      uVar7 = local_120;
    }
    if ((ulong)(local_128 + local_e8) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_f0);
      goto LAB_00151d21;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_130);
LAB_00151d21:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR4(type, ne_a, pad_0, pad_1);
    }